

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::Switch::mousePressEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  SwitchPrivate *pSVar2;
  QPoint QVar3;
  double dVar4;
  double in_XMM1_Qa;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    dVar4 = (double)QEventPoint::position();
    QVar3.xp = (int)((double)((ulong)dVar4 & 0x8000000000000000 | 0x3fe0000000000000) + dVar4);
    QVar3.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar3;
    pSVar2 = (this->d).d;
    pSVar2->leftMouseButtonPressed = true;
    pSVar2->mouseMoveDelta = 0;
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
Switch::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->mouseMoveDelta = 0;

		event->accept();
	}
	else
		event->ignore();
}